

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.cpp
# Opt level: O2

void __thiscall
wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t::process
          (start_of_frame_1_t *this,symbol_sm_t *ctx,optional<bool> *symbol)

{
  pointer __p;
  reference_const_type pbVar1;
  pointer __p_00;
  size_t sVar2;
  __uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t>_>
  local_28;
  __uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
  local_20;
  
  if ((symbol->super_type).m_initialized == false) {
    this->cnt = 0;
  }
  else {
    pbVar1 = boost::optional<bool>::get(symbol);
    sVar2 = 0;
    if (*pbVar1 != false) {
      sVar2 = this->cnt + 1;
    }
    this->cnt = sVar2;
    if (sVar2 == 5) {
      __p_00 = (pointer)operator_new(0x10);
      __p_00->_vptr_state_base_t = (_func_int **)&PTR_process_00116cf0;
      __p_00[1]._vptr_state_base_t = (_func_int **)0x0;
      local_28._M_t.
      super__Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t>_>
      .super__Head_base<0UL,_wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t_*,_false>.
      _M_head_impl = (tuple<wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t>_>
                      )(_Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t>_>
                        )0x0;
      local_20._M_t.
      super__Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
      .super__Head_base<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_false>.
      _M_head_impl = (tuple<wavingz::demod::state_machine::symbol_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
                      )(_Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
                        )0x0;
      std::
      __uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
      ::reset((__uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
               *)&ctx->current_state_m,__p_00);
      std::
      unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
      ::~unique_ptr((unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
                     *)&local_20);
      std::
      unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t>_>
      ::~unique_ptr((unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t>_>
                     *)&local_28);
    }
  }
  return;
}

Assistant:

void
start_of_frame_1_t::process(symbol_sm_t& ctx,
                            const boost::optional<bool>& symbol)
{
    if (symbol == boost::none)
    {
        cnt = 0;
    }
    else
    {
        cnt = *symbol ? cnt + 1 : 0;
        if (cnt == 5) // we wait for 5 consecutive '1' (the last 1 of the
                      // preamble, plus the first nibble of the SOF)
        {
            ctx.state(
              std::unique_ptr<start_of_frame_0_t>(new start_of_frame_0_t()));
        }
    }
}